

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  int ret;
  timeval tv;
  nvamemtiming_conf conf;
  unsigned_long total_time;
  unsigned_long start_time;
  nvamemtiming_conf *in_stack_ffffffffffffff78;
  nvamemtiming_conf *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int local_6c;
  nvamemtiming_conf *in_stack_ffffffffffffff98;
  nvamemtiming_conf *pnVar3;
  nvamemtiming_conf *in_stack_ffffffffffffffa8;
  ushort local_50;
  undefined4 local_4c;
  int local_4;
  
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar1 = nva_init();
  if (iVar1 == 0) {
    parse_cmd_line(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    iVar1 = vbios_read((char *)in_stack_ffffffffffffff88,(uint8_t **)in_stack_ffffffffffffff80,
                       (uint16_t *)in_stack_ffffffffffffff78);
    if (iVar1 == 1) {
      local_6c = read_timings(in_stack_ffffffffffffff78);
      if (local_6c == 0) {
        gettimeofday((timeval *)&stack0xffffffffffffff98,(__timezone_ptr_t)0x0);
        pnVar3 = in_stack_ffffffffffffff98;
        switch(local_4c) {
        case 0:
          local_6c = shallow_dump(in_stack_ffffffffffffffa8);
          break;
        case 1:
          local_6c = bitfield_check(in_stack_ffffffffffffff98);
          break;
        case 2:
          local_6c = manual_check(in_stack_ffffffffffffff98);
          break;
        case 3:
          local_6c = deep_dump(in_stack_ffffffffffffffa8);
        }
        gettimeofday((timeval *)&stack0xffffffffffffff98,(__timezone_ptr_t)0x0);
        uVar2 = (long)pnVar3 - (long)in_stack_ffffffffffffff98;
        printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)local_50,uVar2 / 0xe10,
               (uVar2 % 0xe10) / 0x3c,uVar2 % 0x3c);
        local_4 = local_6c;
      }
      else {
        fprintf(_stderr,"read_timings failed!\n");
        local_4 = local_6c;
      }
    }
    else {
      fprintf(_stderr,"Error while reading the vbios\n");
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
	unsigned long start_time, total_time;
	struct nvamemtiming_conf conf;
	struct timeval tv;
	int ret;

	signal(SIGINT, signal_handler);
	signal(SIGSEGV, signal_handler);

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	parse_cmd_line(argc, argv, &conf);

	/* read the vbios */
	if (vbios_read(conf.vbios.file, &conf.vbios.data, &conf.vbios.length) != 1) {
		fprintf(stderr, "Error while reading the vbios\n");
		return 1;
	}

	/* parse the timing table */
	ret = read_timings(&conf);
	if (ret) {
		fprintf(stderr, "read_timings failed!\n");
		return ret;
	}

	/* start the counter to return how long did the run take */
	gettimeofday(&tv, NULL);
	start_time = tv.tv_sec;

	switch (conf.mode) {
	case MODE_AUTO:
		ret = shallow_dump(&conf);
		break;
	case MODE_DEEP:
		ret = deep_dump(&conf);
		break;
	case MODE_BITFIELD:
		ret = bitfield_check(&conf);
		break;
	case MODE_MANUAL:
		ret = manual_check(&conf);
		break;
	}

	gettimeofday(&tv, NULL);
	total_time = tv.tv_sec - start_time;

	printf("The run tested %i configurations in %li:%li:%lis\n",
	       conf.counter,
	       total_time / 3600,
	       (total_time % 3600) / 60,
	       total_time % 60);

	return ret;
}